

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O3

bool ON_EvTangent(ON_3dVector *D1,ON_3dVector *D2,ON_3dVector *T)

{
  double dVar1;
  ON_3dVector local_30;
  
  dVar1 = ON_3dVector::Length(D1);
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    ON_3dVector::operator/(&local_30,D1,dVar1);
    T->z = local_30.z;
  }
  else {
    dVar1 = ON_3dVector::Length(D2);
    if (dVar1 <= 0.0) {
      T->z = ON_3dVector::ZeroVector.z;
      dVar1 = ON_3dVector::ZeroVector.y;
      T->x = ON_3dVector::ZeroVector.x;
      T->y = dVar1;
      return false;
    }
    ON_3dVector::operator/(&local_30,D2,dVar1);
    T->z = local_30.z;
  }
  *(undefined4 *)&T->x = local_30.x._0_4_;
  *(undefined4 *)((long)&T->x + 4) = local_30.x._4_4_;
  *(undefined4 *)&T->y = local_30.y._0_4_;
  *(undefined4 *)((long)&T->y + 4) = local_30.y._4_4_;
  return true;
}

Assistant:

bool ON_EvTangent( 
        const ON_3dVector& D1, // first derivative
        const ON_3dVector& D2, // second derivative
        ON_3dVector& T         // Unit tangent returned here
        )
{
  // Evaluate unit tangent from first and second derivatives
  // T = D1 / |D1|

  bool rc = false;
  double d1 = D1.Length();

  if (d1 == 0.0) 
  {
    // Use L'hopital's rule to show that if the unit tangent
    // exists and the 1rst derivative is zero and the 2nd derivative is
    // nonzero, then the unit tangent is equal to +/-the unitized 
    // 2nd derivative.  The sign is equal to the sign of D1(s) o D2(s)
    // as s approaches the evaluation parameter.
    //
    d1 = D2.Length();
    if (d1 > 0.0) 
    {
      T = D2/d1;
      rc = true;
    }
    else 
    {
      T = ON_3dVector::ZeroVector;
    }
  }
  else 
  {
    T = D1/d1;
    rc = true;
  }
  return rc;  
}